

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int128.cpp
# Opt level: O3

double __thiscall Omega_h::Int128::to_double(Int128 *this,double unit)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  uVar1 = this->high;
  uVar2 = this->low;
  uVar4 = -uVar2;
  uVar5 = -uVar1 - (ulong)(uVar2 != 0);
  if (-1 < (long)uVar1) {
    uVar4 = uVar2;
    uVar5 = uVar1;
  }
  if (uVar5 != 0) {
    do {
      uVar4 = uVar4 >> 1 | uVar5 << 0x3f;
      unit = unit + unit;
      bVar3 = 1 < uVar5;
      uVar5 = (long)uVar5 >> 1;
    } while (bVar3);
  }
  auVar7._8_4_ = (int)(uVar4 >> 0x20);
  auVar7._0_8_ = uVar4;
  auVar7._12_4_ = 0x45300000;
  dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
  if ((long)uVar1 < 0) {
    dVar6 = -dVar6;
  }
  return unit * dVar6;
}

Assistant:

double Int128::to_double(double unit) const {
  Int128 tmp = *this;
  if (tmp < Int128(0)) tmp = -tmp;
  while (tmp.high) {
    tmp = tmp >> 1;
    unit *= 2;
  }
  double x = tmp.low;
  if (*this < Int128(0)) x = -x;
  x *= unit;
  return x;
}